

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.cc
# Opt level: O1

void __thiscall iqxmlrpc::Print_value_visitor::do_visit_struct(Print_value_visitor *this,Struct *s)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->out_,"{",1);
  for (p_Var2 = (s->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(s->values)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = this->out_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," \'",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' => ",5);
    Value::apply_visitor(*(Value **)(p_Var2 + 2),&this->super_Value_type_visitor);
    std::__ostream_insert<char,std::char_traits<char>>(this->out_,",",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out_," }",2);
  return;
}

Assistant:

void Print_value_visitor::do_visit_struct(const Struct& s)
{
  out_ << "{";

  typedef Struct::const_iterator CI;
  for(CI i = s.begin(); i != s.end(); ++i )
  {
    out_ << " '" << i->first << "' => ";
    i->second->apply_visitor(*this);
    out_ << ",";
  }

  out_ << " }";
}